

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlFAParseRegExp(xmlRegParserCtxtPtr ctxt,int top)

{
  xmlRegStatePtr pxVar1;
  xmlRegStatePtr to;
  xmlChar *pxVar2;
  xmlChar xVar3;
  
  pxVar1 = ctxt->state;
  ctxt->end = (xmlRegStatePtr)0x0;
  xmlFAParseBranch(ctxt,(xmlRegStatePtr)0x0);
  if (top != 0) {
    ctxt->state->type = XML_REGEXP_FINAL_STATE;
  }
  pxVar2 = ctxt->cur;
  to = ctxt->state;
  if (*pxVar2 == '|') {
    xVar3 = '|';
    while ((xVar3 == '|' && (ctxt->error == 0))) {
      ctxt->cur = pxVar2 + 1;
      ctxt->state = pxVar1;
      ctxt->end = (xmlRegStatePtr)0x0;
      xmlFAParseBranch(ctxt,to);
      pxVar2 = ctxt->cur;
      xVar3 = *pxVar2;
    }
    if (top != 0) {
      return;
    }
    ctxt->state = to;
  }
  ctxt->end = to;
  return;
}

Assistant:

static void
xmlFAParseRegExp(xmlRegParserCtxtPtr ctxt, int top) {
    xmlRegStatePtr start, end;

    /* if not top start should have been generated by an epsilon trans */
    start = ctxt->state;
    ctxt->end = NULL;
    xmlFAParseBranch(ctxt, NULL);
    if (top) {
	ctxt->state->type = XML_REGEXP_FINAL_STATE;
    }
    if (CUR != '|') {
	ctxt->end = ctxt->state;
	return;
    }
    end = ctxt->state;
    while ((CUR == '|') && (ctxt->error == 0)) {
	NEXT;
	ctxt->state = start;
	ctxt->end = NULL;
	xmlFAParseBranch(ctxt, end);
    }
    if (!top) {
	ctxt->state = end;
	ctxt->end = end;
    }
}